

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O2

mraa_result_t mraa_intel_edison_i2c_init_pre(uint bus)

{
  int sysfs;
  mraa_gpio_context p_Var1;
  mraa_gpio_context p_Var2;
  ulong uVar3;
  
  uVar3 = (ulong)bus;
  if (miniboard == '\0') {
    if (bus != 6) {
      syslog(3,"edison: You can\'t use that bus, switching to bus 6");
    }
    mraa_gpio_write(tristate,0);
    p_Var1 = mraa_gpio_init_raw(0xe);
    p_Var2 = mraa_gpio_init_raw(0xa5);
    mraa_gpio_dir(p_Var1,MRAA_GPIO_IN);
    mraa_gpio_dir(p_Var2,MRAA_GPIO_IN);
    mraa_gpio_close(p_Var1);
    mraa_gpio_close(p_Var2);
    p_Var1 = mraa_gpio_init_raw(0xec);
    p_Var2 = mraa_gpio_init_raw(0xed);
    mraa_gpio_dir(p_Var1,MRAA_GPIO_OUT);
    mraa_gpio_dir(p_Var2,MRAA_GPIO_OUT);
    mraa_gpio_write(p_Var1,0);
    mraa_gpio_write(p_Var2,0);
    mraa_gpio_close(p_Var1);
    mraa_gpio_close(p_Var2);
    p_Var1 = mraa_gpio_init_raw(0xd4);
    p_Var2 = mraa_gpio_init_raw(0xd5);
    mraa_gpio_dir(p_Var1,MRAA_GPIO_IN);
    mraa_gpio_dir(p_Var2,MRAA_GPIO_IN);
    mraa_gpio_close(p_Var1);
    mraa_gpio_close(p_Var2);
    mraa_intel_edison_pinmode_change(0x1c,1);
    mraa_intel_edison_pinmode_change(0x1b,1);
    mraa_gpio_write(tristate,1);
  }
  else {
    if ((bus != 1) && (bus != 6)) {
      syslog(3,"edison: You can\'t use that bus, switching to bus 6");
      uVar3 = 6;
    }
    sysfs = plat->pins[plat->i2c_bus[uVar3].scl].gpio.pinmap;
    mraa_intel_edison_pinmode_change(plat->pins[plat->i2c_bus[uVar3].sda].gpio.pinmap,1);
    mraa_intel_edison_pinmode_change(sysfs,1);
  }
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_intel_edison_i2c_init_pre(unsigned int bus)
{
    if (miniboard == 0) {
        if (bus != 6) {
            syslog(LOG_ERR, "edison: You can't use that bus, switching to bus 6");
            bus = 6;
        }
        mraa_gpio_write(tristate, 0);
        mraa_gpio_context io18_gpio = mraa_gpio_init_raw(14);
        mraa_gpio_context io19_gpio = mraa_gpio_init_raw(165);
        mraa_gpio_dir(io18_gpio, MRAA_GPIO_IN);
        mraa_gpio_dir(io19_gpio, MRAA_GPIO_IN);
        mraa_gpio_close(io18_gpio);
        mraa_gpio_close(io19_gpio);

        mraa_gpio_context io18_enable = mraa_gpio_init_raw(236);
        mraa_gpio_context io19_enable = mraa_gpio_init_raw(237);
        mraa_gpio_dir(io18_enable, MRAA_GPIO_OUT);
        mraa_gpio_dir(io19_enable, MRAA_GPIO_OUT);
        mraa_gpio_write(io18_enable, 0);
        mraa_gpio_write(io19_enable, 0);
        mraa_gpio_close(io18_enable);
        mraa_gpio_close(io19_enable);

        mraa_gpio_context io18_pullup = mraa_gpio_init_raw(212);
        mraa_gpio_context io19_pullup = mraa_gpio_init_raw(213);
        mraa_gpio_dir(io18_pullup, MRAA_GPIO_IN);
        mraa_gpio_dir(io19_pullup, MRAA_GPIO_IN);
        mraa_gpio_close(io18_pullup);
        mraa_gpio_close(io19_pullup);

        mraa_intel_edison_pinmode_change(28, 1);
        mraa_intel_edison_pinmode_change(27, 1);

        mraa_gpio_write(tristate, 1);
    } else {
        if (bus != 6 && bus != 1) {
            syslog(LOG_ERR, "edison: You can't use that bus, switching to bus 6");
            bus = 6;
        }
        int scl = plat->pins[plat->i2c_bus[bus].scl].gpio.pinmap;
        int sda = plat->pins[plat->i2c_bus[bus].sda].gpio.pinmap;
        mraa_intel_edison_pinmode_change(sda, 1);
        mraa_intel_edison_pinmode_change(scl, 1);
    }

    return MRAA_SUCCESS;
}